

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr,XML_Account account)

{
  byte bVar1;
  STRING_POOL *pool;
  XML_Char XVar2;
  char cVar3;
  DTD *pDVar4;
  ATTRIBUTE *pAVar5;
  DEFAULT_ATTRIBUTE *pDVar6;
  undefined8 *puVar7;
  XML_Char *pXVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  XML_Bool XVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  XML_Error XVar17;
  uint uVar18;
  int iVar19;
  ELEMENT_TYPE *elementType;
  XML_Char *pXVar20;
  ATTRIBUTE *pAVar21;
  ATTRIBUTE_ID *pAVar22;
  long lVar23;
  char *pcVar24;
  NS_ATT *pNVar25;
  unsigned_long uVar26;
  NAMED *pNVar27;
  size_t sVar28;
  uint64_t uVar29;
  TAG *pTVar30;
  size_t len;
  ulong uVar31;
  ulong uVar32;
  byte bVar33;
  NS_ATT *pNVar34;
  long lVar35;
  BINDING *pBVar36;
  char *pcVar37;
  int iVar38;
  bool bVar39;
  bool bVar40;
  siphash sip_state;
  XML_Account in_stack_fffffffffffffef8;
  XML_Error local_104;
  unsigned_long local_e0;
  siphash local_68;
  
  pDVar4 = parser->m_dtd;
  elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar4->elementTypes,tagNamePtr->str,0);
  if (elementType == (ELEMENT_TYPE *)0x0) {
    pXVar20 = poolCopyString(&pDVar4->pool,tagNamePtr->str);
    if ((pXVar20 == (XML_Char *)0x0) ||
       (elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar4->elementTypes,pXVar20,0x28),
       elementType == (ELEMENT_TYPE *)0x0)) {
      bVar39 = false;
      elementType = (ELEMENT_TYPE *)0x0;
    }
    else if ((parser->m_ns == '\0') ||
            (iVar13 = setElementTypePrefix(parser,elementType), iVar13 != 0)) {
      bVar39 = true;
    }
    else {
      bVar39 = false;
    }
    if (!bVar39) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  uVar18 = elementType->nDefaultAtts;
  uVar14 = (*enc->getAtts)(enc,attStr,parser->m_attsSize,parser->m_atts);
  if ((int)(uVar18 ^ 0x7fffffff) < (int)uVar14) {
    return XML_ERROR_NO_MEMORY;
  }
  iVar15 = uVar14 + uVar18;
  iVar13 = parser->m_attsSize;
  if (iVar13 < iVar15) {
    if ((int)(0x7fffffef - uVar18) < (int)uVar14 || 0x7fffffef < (int)uVar18) {
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attsSize = iVar15 + 0x10;
    pAVar21 = (ATTRIBUTE *)
              (*(parser->m_mem).realloc_fcn)(parser->m_atts,(long)iVar15 * 0x20 + 0x200);
    if (pAVar21 == (ATTRIBUTE *)0x0) {
      parser->m_attsSize = iVar13;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = pAVar21;
    if (iVar13 < (int)uVar14) {
      (*enc->getAtts)(enc,attStr,uVar14,pAVar21);
    }
  }
  pAVar21 = parser->m_atts;
  if ((int)uVar14 < 1) {
    local_104 = XML_ERROR_NO_MEMORY;
    iVar15 = 0;
    iVar13 = 0;
  }
  else {
    uVar31 = 0;
    local_104 = XML_ERROR_NO_MEMORY;
    iVar13 = 0;
    iVar15 = 0;
    do {
      pcVar24 = parser->m_atts[uVar31].name;
      iVar16 = (*enc->nameLength)(enc,pcVar24);
      pAVar22 = getAttributeId(parser,enc,pcVar24,pcVar24 + iVar16);
      if (pAVar22 == (ATTRIBUTE_ID *)0x0) {
        bVar39 = false;
        local_104 = XML_ERROR_NO_MEMORY;
      }
      else if (pAVar22->name[-1] == '\0') {
        pAVar22->name[-1] = '\x01';
        iVar16 = iVar13 + 1;
        (&pAVar21->name)[iVar13] = pAVar22->name;
        pAVar5 = parser->m_atts;
        if (pAVar5[uVar31].normalized == '\0') {
          XVar12 = '\x01';
          if ((pAVar22->maybeTokenized != '\0') && (0 < (int)uVar18)) {
            lVar23 = 0;
            do {
              if (pAVar22 == *(ATTRIBUTE_ID **)((long)&elementType->defaultAtts->id + lVar23)) {
                XVar12 = (&elementType->defaultAtts->isCdata)[lVar23];
                break;
              }
              lVar23 = lVar23 + 0x18;
            } while ((ulong)uVar18 * 0x18 != lVar23);
          }
          XVar17 = storeAttributeValue(parser,enc,XVar12,pAVar5[uVar31].valuePtr,
                                       pAVar5[uVar31].valueEnd,&parser->m_tempPool,
                                       in_stack_fffffffffffffef8);
          if (XVar17 == XML_ERROR_NONE) {
            (&pAVar21->name)[iVar16] = (parser->m_tempPool).start;
            (parser->m_tempPool).start = (parser->m_tempPool).ptr;
            goto LAB_0063a19f;
          }
          bVar39 = false;
          local_104 = XVar17;
          iVar13 = iVar16;
        }
        else {
          pXVar20 = poolStoreString(&parser->m_tempPool,enc,pAVar5[uVar31].valuePtr,
                                    pAVar5[uVar31].valueEnd);
          (&pAVar21->name)[iVar16] = pXVar20;
          if (pXVar20 == (XML_Char *)0x0) {
            bVar39 = false;
            local_104 = XML_ERROR_NO_MEMORY;
            iVar13 = iVar16;
          }
          else {
            (parser->m_tempPool).start = (parser->m_tempPool).ptr;
LAB_0063a19f:
            if (pAVar22->prefix != (PREFIX *)0x0) {
              if (pAVar22->xmlns != '\0') {
                XVar17 = addBinding(parser,pAVar22->prefix,pAVar22,(&pAVar21->name)[iVar16],
                                    bindingsPtr);
                bVar39 = XVar17 == XML_ERROR_NONE;
                if (!bVar39) {
                  local_104 = XVar17;
                  iVar13 = iVar16;
                }
                goto LAB_0063a21b;
              }
              iVar15 = iVar15 + 1;
              pAVar22->name[-1] = '\x02';
            }
            bVar39 = true;
            iVar13 = iVar13 + 2;
          }
        }
      }
      else {
        local_104 = XML_ERROR_DUPLICATE_ATTRIBUTE;
        if (parser->m_encoding == enc) {
          parser->m_eventPtr = parser->m_atts[uVar31].name;
        }
        bVar39 = false;
      }
LAB_0063a21b:
      if (!bVar39) {
        return local_104;
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 != uVar14);
  }
  parser->m_nSpecifiedAtts = iVar13;
  lVar23 = 0xffffffff;
  if ((elementType->idAtt == (ATTRIBUTE_ID *)0x0) ||
     (pXVar20 = elementType->idAtt->name, pXVar20[-1] == '\0')) {
LAB_0063a2a9:
    parser->m_idAttIndex = (int)lVar23;
  }
  else if (0 < iVar13) {
    lVar23 = 0;
    do {
      if ((&pAVar21->name)[lVar23] == pXVar20) goto LAB_0063a2a9;
      lVar23 = lVar23 + 2;
    } while ((int)lVar23 < iVar13);
  }
  if (0 < (int)uVar18) {
    lVar23 = 0;
    do {
      pDVar6 = elementType->defaultAtts;
      pAVar22 = *(ATTRIBUTE_ID **)((long)&pDVar6->id + lVar23);
      pXVar20 = pAVar22->name;
      bVar39 = true;
      if ((pXVar20[-1] == '\0') &&
         (pXVar8 = *(XML_Char **)((long)&pDVar6->value + lVar23), pXVar8 != (XML_Char *)0x0)) {
        if (pAVar22->prefix == (PREFIX *)0x0) {
          pXVar20[-1] = '\x01';
          (&pAVar21->name)[iVar13] = (char *)**(undefined8 **)((long)&pDVar6->id + lVar23);
          pcVar24 = *(char **)((long)&pDVar6->value + lVar23);
        }
        else {
          if (pAVar22->xmlns != '\0') {
            XVar17 = addBinding(parser,pAVar22->prefix,pAVar22,pXVar8,bindingsPtr);
            bVar39 = XVar17 == XML_ERROR_NONE;
            if (!bVar39) {
              local_104 = XVar17;
            }
            goto LAB_0063a2de;
          }
          pXVar20[-1] = '\x02';
          iVar15 = iVar15 + 1;
          (&pAVar21->name)[iVar13] = (char *)**(undefined8 **)((long)&pDVar6->id + lVar23);
          pcVar24 = *(char **)((long)&pDVar6->value + lVar23);
        }
        (&pAVar21->valuePtr)[iVar13] = pcVar24;
        iVar13 = iVar13 + 2;
      }
LAB_0063a2de:
      if (!bVar39) {
        return local_104;
      }
      lVar23 = lVar23 + 0x18;
    } while ((ulong)uVar18 * 0x18 != lVar23);
  }
  (&pAVar21->name)[iVar13] = (char *)0x0;
  if (iVar15 == 0) {
    iVar38 = 0;
    goto LAB_0063a988;
  }
  bVar33 = parser->m_nsAttsPower;
  if (bVar33 < 0x20) {
    iVar16 = 1 << (bVar33 & 0x1f);
    local_e0 = parser->m_nsAttsVersion;
    if (iVar15 * 2 >> (bVar33 & 0x1f) == 0) {
LAB_0063a4a6:
      if (local_e0 == 0) {
        local_e0 = 0xffffffff;
        lVar23 = (long)iVar16;
        pNVar25 = parser->m_nsAtts + lVar23;
        do {
          pNVar25 = pNVar25 + -1;
          pNVar25->version = 0xffffffff;
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
      local_e0 = local_e0 - 1;
      parser->m_nsAttsVersion = local_e0;
      bVar10 = true;
      if (0 < iVar13) {
        pool = &parser->m_tempPool;
        uVar18 = iVar16 - 1;
        iVar38 = 0;
LAB_0063a540:
        pcVar24 = (&pAVar21->name)[iVar38];
        if (pcVar24[-1] == '\x02') {
          uVar26 = get_hash_secret_salt(parser);
          local_68.v0 = 0x736f6d6570736575;
          local_68.v1 = uVar26 ^ 0x646f72616e646f6d;
          local_68.v2 = 0x6c7967656e657261;
          local_68.v3 = uVar26 ^ 0x7465646279746573;
          local_68.p = local_68.buf;
          local_68.c = 0;
          pcVar24[-1] = '\0';
          pNVar27 = lookup(parser,&pDVar4->attributeIds,pcVar24,0);
          if ((pNVar27 == (NAMED *)0x0) || (pNVar27[1].name == (KEY)0x0)) {
            local_104 = XML_ERROR_NO_MEMORY;
          }
          else {
            puVar7 = *(undefined8 **)(pNVar27[1].name + 8);
            if (puVar7 == (undefined8 *)0x0) {
              local_104 = XML_ERROR_UNBOUND_PREFIX;
            }
            else {
              iVar19 = *(int *)(puVar7 + 5);
              if (0 < iVar19) {
                lVar23 = 0;
                do {
                  XVar2 = *(XML_Char *)(puVar7[4] + lVar23);
                  if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                     (XVar12 = poolGrow(pool), XVar12 == '\0')) {
                    local_104 = XML_ERROR_NO_MEMORY;
                    bVar39 = false;
                  }
                  else {
                    pXVar20 = (parser->m_tempPool).ptr;
                    (parser->m_tempPool).ptr = pXVar20 + 1;
                    *pXVar20 = XVar2;
                    bVar39 = true;
                  }
                  if (!bVar39) goto LAB_0063a939;
                  lVar23 = lVar23 + 1;
                  iVar19 = *(int *)(puVar7 + 5);
                } while (lVar23 < iVar19);
              }
              sip24_update(&local_68,(void *)puVar7[4],(long)iVar19);
              do {
                pcVar37 = pcVar24;
                pcVar24 = pcVar37 + 1;
              } while (*pcVar37 != ':');
              if (*pcVar24 == '\0') {
                len = 0;
              }
              else {
                sVar28 = 0;
                do {
                  len = sVar28 + 1;
                  lVar23 = sVar28 + 2;
                  sVar28 = len;
                } while (pcVar37[lVar23] != '\0');
              }
              sip24_update(&local_68,pcVar24,len);
              do {
                if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                   (XVar12 = poolGrow(pool), XVar12 == '\0')) goto LAB_0063a92f;
                cVar3 = *pcVar24;
                pcVar37 = (parser->m_tempPool).ptr;
                (parser->m_tempPool).ptr = pcVar37 + 1;
                *pcVar37 = cVar3;
                cVar3 = *pcVar24;
                pcVar24 = pcVar24 + 1;
              } while (cVar3 != '\0');
              uVar29 = sip24_final(&local_68);
              uVar14 = uVar18 & (uint)uVar29;
              pNVar25 = parser->m_nsAtts;
              lVar23 = (long)(int)uVar14;
              bVar39 = pNVar25[lVar23].version == local_e0;
              if (bVar39) {
                pNVar34 = pNVar25 + lVar23;
                bVar33 = 0;
                do {
                  if (uVar29 == pNVar34->hash) {
                    pcVar24 = (parser->m_tempPool).start;
                    cVar3 = *pcVar24;
                    bVar40 = cVar3 == '\0';
                    if ((!bVar40) && (cVar3 == *pNVar34->uriName)) {
                      lVar35 = 1;
                      do {
                        cVar3 = pcVar24[lVar35];
                        bVar40 = cVar3 == '\0';
                        if (bVar40) break;
                        pcVar37 = pNVar34->uriName + lVar35;
                        lVar35 = lVar35 + 1;
                      } while (cVar3 == *pcVar37);
                    }
                    if (bVar40) {
                      local_104 = XML_ERROR_DUPLICATE_ATTRIBUTE;
                      break;
                    }
                  }
                  if (bVar33 == 0) {
                    bVar33 = (byte)((uVar29 & ~(ulong)uVar18) >>
                                   ((char)*(undefined4 *)&parser->m_nsAttsPower - 1U & 0x3f)) &
                             (byte)(uVar18 >> 2) | 1;
                  }
                  iVar19 = 0;
                  if ((int)uVar14 < (int)(uint)bVar33) {
                    iVar19 = iVar16;
                  }
                  uVar14 = (uVar14 - bVar33) + iVar19;
                  lVar23 = (long)(int)uVar14;
                  pNVar34 = pNVar25 + lVar23;
                  bVar39 = pNVar34->version == local_e0;
                } while (bVar39);
              }
              if (!bVar39) {
                if (parser->m_ns_triplets != '\0') {
                  (parser->m_tempPool).ptr[-1] = parser->m_namespaceSeparator;
                  pcVar24 = *(char **)*puVar7;
                  do {
                    if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                       (XVar12 = poolGrow(pool), XVar12 == '\0')) goto LAB_0063a92f;
                    cVar3 = *pcVar24;
                    pcVar37 = (parser->m_tempPool).ptr;
                    (parser->m_tempPool).ptr = pcVar37 + 1;
                    *pcVar37 = cVar3;
                    cVar3 = *pcVar24;
                    pcVar24 = pcVar24 + 1;
                  } while (cVar3 != '\0');
                }
                pcVar24 = (parser->m_tempPool).start;
                (parser->m_tempPool).start = (parser->m_tempPool).ptr;
                (&pAVar21->name)[iVar38] = pcVar24;
                pNVar25 = parser->m_nsAtts;
                pNVar25[lVar23].version = local_e0;
                pNVar25[lVar23].hash = uVar29;
                pNVar25[lVar23].uriName = pcVar24;
                iVar15 = iVar15 + -1;
                if (iVar15 != 0) goto LAB_0063a684;
                iVar38 = iVar38 + 2;
                iVar15 = 0;
                iVar19 = 0x12;
                goto LAB_0063a93e;
              }
            }
          }
          goto LAB_0063a939;
        }
        pcVar24[-1] = '\0';
LAB_0063a684:
        iVar19 = 0;
        goto LAB_0063a93e;
      }
      goto LAB_0063a974;
    }
    bVar11 = parser->m_nsAttsPower;
    do {
      bVar1 = bVar11 + 1;
      bVar9 = bVar11 & 0x1f;
      bVar11 = bVar1;
    } while (iVar15 >> bVar9 != 0);
    bVar11 = 3;
    if (3 < bVar1) {
      bVar11 = bVar1;
    }
    parser->m_nsAttsPower = bVar11;
    if (bVar1 < 0x20) {
      iVar16 = 1 << (bVar11 & 0x1f);
      pNVar25 = (NS_ATT *)(*(parser->m_mem).realloc_fcn)(parser->m_nsAtts,0x18L << (bVar11 & 0x3f));
      if (pNVar25 == (NS_ATT *)0x0) {
        parser->m_nsAttsPower = bVar33;
        goto LAB_0063a48e;
      }
      parser->m_nsAtts = pNVar25;
      bVar39 = true;
      local_e0 = 0;
    }
    else {
      parser->m_nsAttsPower = bVar33;
LAB_0063a48e:
      local_104 = XML_ERROR_NO_MEMORY;
      bVar39 = false;
    }
    iVar38 = 0;
    bVar10 = false;
    if (bVar39) goto LAB_0063a4a6;
  }
  else {
    bVar10 = false;
    local_104 = XML_ERROR_NO_MEMORY;
LAB_0063a974:
    iVar38 = 0;
  }
LAB_0063a977:
  if (!bVar10) {
    return local_104;
  }
LAB_0063a988:
  if (iVar38 < iVar13) {
    lVar23 = (long)iVar38;
    do {
      (&pAVar21->name)[lVar23][-1] = '\0';
      lVar23 = lVar23 + 2;
    } while (lVar23 < iVar13);
  }
  for (pBVar36 = *bindingsPtr; pBVar36 != (BINDING *)0x0; pBVar36 = pBVar36->nextTagBinding) {
    pBVar36->attId->name[-1] = '\0';
  }
  XVar17 = XML_ERROR_NONE;
  if (parser->m_ns != '\0') {
    if (elementType->prefix == (PREFIX *)0x0) {
      pBVar36 = (pDVar4->defaultPrefix).binding;
      if (pBVar36 == (BINDING *)0x0) {
        return XML_ERROR_NONE;
      }
      pcVar24 = tagNamePtr->str;
    }
    else {
      pBVar36 = elementType->prefix->binding;
      if (pBVar36 == (BINDING *)0x0) {
        return XML_ERROR_UNBOUND_PREFIX;
      }
      pcVar24 = tagNamePtr->str;
      do {
        cVar3 = *pcVar24;
        pcVar24 = pcVar24 + 1;
      } while (cVar3 != ':');
    }
    lVar23 = 0;
    if ((parser->m_ns_triplets != '\0') &&
       (pXVar20 = pBVar36->prefix->name, pXVar20 != (XML_Char *)0x0)) {
      lVar23 = 0;
      do {
        pcVar37 = pXVar20 + lVar23;
        lVar23 = lVar23 + 1;
      } while (*pcVar37 != '\0');
    }
    tagNamePtr->localPart = pcVar24;
    iVar13 = pBVar36->uriLen;
    tagNamePtr->uriLen = iVar13;
    tagNamePtr->prefix = pBVar36->prefix->name;
    uVar18 = (uint)lVar23;
    tagNamePtr->prefixLen = uVar18;
    uVar31 = 0;
    do {
      uVar32 = uVar31;
      uVar31 = uVar32 + 1;
    } while (pcVar24[uVar32] != '\0');
    XVar17 = XML_ERROR_NO_MEMORY;
    if (iVar13 <= (int)(uVar18 ^ 0x7fffffff)) {
      iVar15 = (int)uVar31;
      uVar14 = iVar13 + uVar18;
      if (iVar15 - 1U < (uVar14 ^ 0x7fffffff)) {
        if (pBVar36->uriAlloc < (int)(uVar14 + iVar15)) {
          if ((int)(uVar14 + iVar15) < 0x7fffffe8) {
            iVar13 = uVar14 + iVar15 + 0x18;
            pXVar20 = (XML_Char *)(*(parser->m_mem).malloc_fcn)((long)iVar13);
            if (pXVar20 == (XML_Char *)0x0) {
              bVar39 = false;
              local_104 = XML_ERROR_NO_MEMORY;
            }
            else {
              pBVar36->uriAlloc = iVar13;
              memcpy(pXVar20,pBVar36->uri,(long)pBVar36->uriLen);
              pTVar30 = parser->m_tagStack;
              if (pTVar30 != (TAG *)0x0) {
                pXVar8 = pBVar36->uri;
                do {
                  if ((pTVar30->name).str == pXVar8) {
                    (pTVar30->name).str = pXVar20;
                  }
                  pTVar30 = pTVar30->parent;
                } while (pTVar30 != (tag *)0x0);
              }
              (*(parser->m_mem).free_fcn)(pBVar36->uri);
              pBVar36->uri = pXVar20;
              bVar39 = true;
            }
          }
          else {
            bVar39 = false;
            local_104 = XML_ERROR_NO_MEMORY;
          }
          if (!bVar39) {
            return local_104;
          }
        }
        pXVar20 = pBVar36->uri + pBVar36->uriLen;
        memcpy(pXVar20,pcVar24,uVar31 & 0xffffffff);
        if (uVar18 != 0) {
          pXVar20[uVar32] = parser->m_namespaceSeparator;
          memcpy(pXVar20 + uVar31,pBVar36->prefix->name,(long)(int)uVar18);
        }
        tagNamePtr->str = pBVar36->uri;
        XVar17 = XML_ERROR_NONE;
      }
    }
  }
  return XVar17;
LAB_0063a92f:
  local_104 = XML_ERROR_NO_MEMORY;
LAB_0063a939:
  iVar19 = 1;
LAB_0063a93e:
  if (iVar19 != 0) {
    bVar10 = true;
    if (iVar19 != 0x12) {
      bVar10 = false;
    }
    goto LAB_0063a977;
  }
  iVar38 = iVar38 + 2;
  if (iVar13 <= iVar38) goto LAB_0063a977;
  goto LAB_0063a540;
}

Assistant:

static enum XML_Error
storeAtts(XML_Parser parser, const ENCODING *enc, const char *attStr,
          TAG_NAME *tagNamePtr, BINDING **bindingsPtr,
          enum XML_Account account) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  ELEMENT_TYPE *elementType;
  int nDefaultAtts;
  const XML_Char **appAtts; /* the attribute list for the application */
  int attIndex = 0;
  int prefixLen;
  int i;
  int n;
  XML_Char *uri;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  elementType
      = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, tagNamePtr->str, 0);
  if (! elementType) {
    const XML_Char *name = poolCopyString(&dtd->pool, tagNamePtr->str);
    if (! name)
      return XML_ERROR_NO_MEMORY;
    elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, name,
                                         sizeof(ELEMENT_TYPE));
    if (! elementType)
      return XML_ERROR_NO_MEMORY;
    if (parser->m_ns && ! setElementTypePrefix(parser, elementType))
      return XML_ERROR_NO_MEMORY;
  }
  nDefaultAtts = elementType->nDefaultAtts;

  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, parser->m_attsSize, parser->m_atts);

  /* Detect and prevent integer overflow */
  if (n > INT_MAX - nDefaultAtts) {
    return XML_ERROR_NO_MEMORY;
  }

  if (n + nDefaultAtts > parser->m_attsSize) {
    int oldAttsSize = parser->m_attsSize;
    ATTRIBUTE *temp;
#ifdef XML_ATTR_INFO
    XML_AttrInfo *temp2;
#endif

    /* Detect and prevent integer overflow */
    if ((nDefaultAtts > INT_MAX - INIT_ATTS_SIZE)
        || (n > INT_MAX - (nDefaultAtts + INIT_ATTS_SIZE))) {
      return XML_ERROR_NO_MEMORY;
    }

    parser->m_attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;

    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)parser->m_attsSize > (size_t)(-1) / sizeof(ATTRIBUTE)) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
#endif

    temp = (ATTRIBUTE *)REALLOC(parser, (void *)parser->m_atts,
                                parser->m_attsSize * sizeof(ATTRIBUTE));
    if (temp == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = temp;
#ifdef XML_ATTR_INFO
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#  if UINT_MAX >= SIZE_MAX
    if ((unsigned)parser->m_attsSize > (size_t)(-1) / sizeof(XML_AttrInfo)) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
#  endif

    temp2 = (XML_AttrInfo *)REALLOC(parser, (void *)parser->m_attInfo,
                                    parser->m_attsSize * sizeof(XML_AttrInfo));
    if (temp2 == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attInfo = temp2;
#endif
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, parser->m_atts);
  }

  appAtts = (const XML_Char **)parser->m_atts;
  for (i = 0; i < n; i++) {
    ATTRIBUTE *currAtt = &parser->m_atts[i];
#ifdef XML_ATTR_INFO
    XML_AttrInfo *currAttInfo = &parser->m_attInfo[i];
#endif
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId
        = getAttributeId(parser, enc, currAtt->name,
                         currAtt->name + XmlNameLength(enc, currAtt->name));
    if (! attId)
      return XML_ERROR_NO_MEMORY;
#ifdef XML_ATTR_INFO
    currAttInfo->nameStart
        = parser->m_parseEndByteIndex - (parser->m_parseEndPtr - currAtt->name);
    currAttInfo->nameEnd
        = currAttInfo->nameStart + XmlNameLength(enc, currAtt->name);
    currAttInfo->valueStart = parser->m_parseEndByteIndex
                              - (parser->m_parseEndPtr - currAtt->valuePtr);
    currAttInfo->valueEnd = parser->m_parseEndByteIndex
                            - (parser->m_parseEndPtr - currAtt->valueEnd);
#endif
    /* Detect duplicate attributes by their QNames. This does not work when
       namespace processing is turned on and different prefixes for the same
       namespace are used. For this case we have a check further down.
    */
    if ((attId->name)[-1]) {
      if (enc == parser->m_encoding)
        parser->m_eventPtr = parser->m_atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (! parser->m_atts[i].normalized) {
      enum XML_Error result;
      XML_Bool isCdata = XML_TRUE;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(
          parser, enc, isCdata, parser->m_atts[i].valuePtr,
          parser->m_atts[i].valueEnd, &parser->m_tempPool, account);
      if (result)
        return result;
      appAtts[attIndex] = poolStart(&parser->m_tempPool);
      poolFinish(&parser->m_tempPool);
    } else {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&parser->m_tempPool, enc,
                                          parser->m_atts[i].valuePtr,
                                          parser->m_atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&parser->m_tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        enum XML_Error result = addBinding(parser, attId->prefix, attId,
                                           appAtts[attIndex], bindingsPtr);
        if (result)
          return result;
        --attIndex;
      } else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    } else
      attIndex++;
  }

  /* set-up for XML_GetSpecifiedAttributeCount and XML_GetIdAttributeIndex */
  parser->m_nSpecifiedAtts = attIndex;
  if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
    for (i = 0; i < attIndex; i += 2)
      if (appAtts[i] == elementType->idAtt->name) {
        parser->m_idAttIndex = i;
        break;
      }
  } else
    parser->m_idAttIndex = -1;

  /* do attribute defaulting */
  for (i = 0; i < nDefaultAtts; i++) {
    const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + i;
    if (! (da->id->name)[-1] && da->value) {
      if (da->id->prefix) {
        if (da->id->xmlns) {
          enum XML_Error result = addBinding(parser, da->id->prefix, da->id,
                                             da->value, bindingsPtr);
          if (result)
            return result;
        } else {
          (da->id->name)[-1] = 2;
          nPrefixes++;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      } else {
        (da->id->name)[-1] = 1;
        appAtts[attIndex++] = da->id->name;
        appAtts[attIndex++] = da->value;
      }
    }
  }
  appAtts[attIndex] = 0;

  /* expand prefixed attribute names, check for duplicates,
     and clear flags that say whether attributes were specified */
  i = 0;
  if (nPrefixes) {
    int j; /* hash table index */
    unsigned long version = parser->m_nsAttsVersion;

    /* Detect and prevent invalid shift */
    if (parser->m_nsAttsPower >= sizeof(unsigned int) * 8 /* bits per byte */) {
      return XML_ERROR_NO_MEMORY;
    }

    unsigned int nsAttsSize = 1u << parser->m_nsAttsPower;
    unsigned char oldNsAttsPower = parser->m_nsAttsPower;
    /* size of hash table must be at least 2 * (# of prefixed attributes) */
    if ((nPrefixes << 1)
        >> parser->m_nsAttsPower) { /* true for m_nsAttsPower = 0 */
      NS_ATT *temp;
      /* hash table size must also be a power of 2 and >= 8 */
      while (nPrefixes >> parser->m_nsAttsPower++)
        ;
      if (parser->m_nsAttsPower < 3)
        parser->m_nsAttsPower = 3;

      /* Detect and prevent invalid shift */
      if (parser->m_nsAttsPower >= sizeof(nsAttsSize) * 8 /* bits per byte */) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }

      nsAttsSize = 1u << parser->m_nsAttsPower;

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if (nsAttsSize > (size_t)(-1) / sizeof(NS_ATT)) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
#endif

      temp = (NS_ATT *)REALLOC(parser, parser->m_nsAtts,
                               nsAttsSize * sizeof(NS_ATT));
      if (! temp) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
      parser->m_nsAtts = temp;
      version = 0; /* force re-initialization of m_nsAtts hash table */
    }
    /* using a version flag saves us from initializing m_nsAtts every time */
    if (! version) { /* initialize version flags when version wraps around */
      version = INIT_ATTS_VERSION;
      for (j = nsAttsSize; j != 0;)
        parser->m_nsAtts[--j].version = version;
    }
    parser->m_nsAttsVersion = --version;

    /* expand prefixed names and check for duplicates */
    for (; i < attIndex; i += 2) {
      const XML_Char *s = appAtts[i];
      if (s[-1] == 2) { /* prefixed */
        ATTRIBUTE_ID *id;
        const BINDING *b;
        unsigned long uriHash;
        struct siphash sip_state;
        struct sipkey sip_key;

        copy_salt_to_sipkey(parser, &sip_key);
        sip24_init(&sip_state, &sip_key);

        ((XML_Char *)s)[-1] = 0; /* clear flag */
        id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, s, 0);
        if (! id || ! id->prefix) {
          /* This code is walking through the appAtts array, dealing
           * with (in this case) a prefixed attribute name.  To be in
           * the array, the attribute must have already been bound, so
           * has to have passed through the hash table lookup once
           * already.  That implies that an entry for it already
           * exists, so the lookup above will return a pointer to
           * already allocated memory.  There is no opportunaity for
           * the allocator to fail, so the condition above cannot be
           * fulfilled.
           *
           * Since it is difficult to be certain that the above
           * analysis is complete, we retain the test and merely
           * remove the code from coverage tests.
           */
          return XML_ERROR_NO_MEMORY; /* LCOV_EXCL_LINE */
        }
        b = id->prefix->binding;
        if (! b)
          return XML_ERROR_UNBOUND_PREFIX;

        for (j = 0; j < b->uriLen; j++) {
          const XML_Char c = b->uri[j];
          if (! poolAppendChar(&parser->m_tempPool, c))
            return XML_ERROR_NO_MEMORY;
        }

        sip24_update(&sip_state, b->uri, b->uriLen * sizeof(XML_Char));

        while (*s++ != XML_T(ASCII_COLON))
          ;

        sip24_update(&sip_state, s, keylen(s) * sizeof(XML_Char));

        do { /* copies null terminator */
          if (! poolAppendChar(&parser->m_tempPool, *s))
            return XML_ERROR_NO_MEMORY;
        } while (*s++);

        uriHash = (unsigned long)sip24_final(&sip_state);

        { /* Check hash table for duplicate of expanded name (uriName).
             Derived from code in lookup(parser, HASH_TABLE *table, ...).
          */
          unsigned char step = 0;
          unsigned long mask = nsAttsSize - 1;
          j = uriHash & mask; /* index into hash table */
          while (parser->m_nsAtts[j].version == version) {
            /* for speed we compare stored hash values first */
            if (uriHash == parser->m_nsAtts[j].hash) {
              const XML_Char *s1 = poolStart(&parser->m_tempPool);
              const XML_Char *s2 = parser->m_nsAtts[j].uriName;
              /* s1 is null terminated, but not s2 */
              for (; *s1 == *s2 && *s1 != 0; s1++, s2++)
                ;
              if (*s1 == 0)
                return XML_ERROR_DUPLICATE_ATTRIBUTE;
            }
            if (! step)
              step = PROBE_STEP(uriHash, mask, parser->m_nsAttsPower);
            j < step ? (j += nsAttsSize - step) : (j -= step);
          }
        }

        if (parser->m_ns_triplets) { /* append namespace separator and prefix */
          parser->m_tempPool.ptr[-1] = parser->m_namespaceSeparator;
          s = b->prefix->name;
          do {
            if (! poolAppendChar(&parser->m_tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
        }

        /* store expanded name in attribute list */
        s = poolStart(&parser->m_tempPool);
        poolFinish(&parser->m_tempPool);
        appAtts[i] = s;

        /* fill empty slot with new version, uriName and hash value */
        parser->m_nsAtts[j].version = version;
        parser->m_nsAtts[j].hash = uriHash;
        parser->m_nsAtts[j].uriName = s;

        if (! --nPrefixes) {
          i += 2;
          break;
        }
      } else                     /* not prefixed */
        ((XML_Char *)s)[-1] = 0; /* clear flag */
    }
  }
  /* clear flags for the remaining attributes */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;

  if (! parser->m_ns)
    return XML_ERROR_NONE;

  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (! binding)
      return XML_ERROR_UNBOUND_PREFIX;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(ASCII_COLON))
      ;
  } else if (dtd->defaultPrefix.binding) {
    binding = dtd->defaultPrefix.binding;
    localPart = tagNamePtr->str;
  } else
    return XML_ERROR_NONE;
  prefixLen = 0;
  if (parser->m_ns_triplets && binding->prefix->name) {
    for (; binding->prefix->name[prefixLen++];)
      ; /* prefixLen includes null terminator */
  }
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  tagNamePtr->prefix = binding->prefix->name;
  tagNamePtr->prefixLen = prefixLen;
  for (i = 0; localPart[i++];)
    ; /* i includes null terminator */

  /* Detect and prevent integer overflow */
  if (binding->uriLen > INT_MAX - prefixLen
      || i > INT_MAX - (binding->uriLen + prefixLen)) {
    return XML_ERROR_NO_MEMORY;
  }

  n = i + binding->uriLen + prefixLen;
  if (n > binding->uriAlloc) {
    TAG *p;

    /* Detect and prevent integer overflow */
    if (n > INT_MAX - EXPAND_SPARE) {
      return XML_ERROR_NO_MEMORY;
    }
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)(n + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
      return XML_ERROR_NO_MEMORY;
    }
#endif

    uri = (XML_Char *)MALLOC(parser, (n + EXPAND_SPARE) * sizeof(XML_Char));
    if (! uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = parser->m_tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(parser, binding->uri);
    binding->uri = uri;
  }
  /* if m_namespaceSeparator != '\0' then uri includes it already */
  uri = binding->uri + binding->uriLen;
  memcpy(uri, localPart, i * sizeof(XML_Char));
  /* we always have a namespace separator between localPart and prefix */
  if (prefixLen) {
    uri += i - 1;
    *uri = parser->m_namespaceSeparator; /* replace null terminator */
    memcpy(uri + 1, binding->prefix->name, prefixLen * sizeof(XML_Char));
  }
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}